

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# selection_vector.cpp
# Opt level: O1

string * __thiscall
duckdb::SelectionVector::ToString_abi_cxx11_
          (string *__return_storage_ptr__,SelectionVector *this,idx_t count)

{
  bool bVar1;
  long lVar2;
  char cVar3;
  long *plVar4;
  long *plVar5;
  size_type *psVar6;
  ulong uVar7;
  idx_t iVar8;
  char cVar9;
  idx_t __val;
  string __str_1;
  string __str;
  long *local_80;
  long local_78;
  long local_70;
  long lStack_68;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_60;
  SelectionVector *local_58;
  char *local_50;
  uint local_48;
  char local_40 [16];
  
  cVar9 = '\x01';
  if (9 < count) {
    iVar8 = count;
    cVar3 = '\x04';
    do {
      cVar9 = cVar3;
      if (iVar8 < 100) {
        cVar9 = cVar9 + -2;
        goto LAB_0131c2d7;
      }
      if (iVar8 < 1000) {
        cVar9 = cVar9 + -1;
        goto LAB_0131c2d7;
      }
      if (iVar8 < 10000) goto LAB_0131c2d7;
      bVar1 = 99999 < iVar8;
      iVar8 = iVar8 / 10000;
      cVar3 = cVar9 + '\x04';
    } while (bVar1);
    cVar9 = cVar9 + '\x01';
  }
LAB_0131c2d7:
  local_58 = this;
  local_50 = local_40;
  ::std::__cxx11::string::_M_construct((ulong)&local_50,cVar9);
  ::std::__detail::__to_chars_10_impl<unsigned_long>(local_50,local_48,count);
  plVar4 = (long *)::std::__cxx11::string::replace((ulong)&local_50,0,(char *)0x0,0x1e1e645);
  plVar5 = plVar4 + 2;
  if ((long *)*plVar4 == plVar5) {
    local_70 = *plVar5;
    lStack_68 = plVar4[3];
    local_80 = &local_70;
  }
  else {
    local_70 = *plVar5;
    local_80 = (long *)*plVar4;
  }
  local_78 = plVar4[1];
  *plVar4 = (long)plVar5;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  plVar4 = (long *)::std::__cxx11::string::append((char *)&local_80);
  local_60 = &__return_storage_ptr__->field_2;
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)local_60;
  psVar6 = (size_type *)(plVar4 + 2);
  if ((size_type *)*plVar4 == psVar6) {
    lVar2 = plVar4[3];
    local_60->_M_allocated_capacity = *psVar6;
    *(long *)((long)&__return_storage_ptr__->field_2 + 8) = lVar2;
  }
  else {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)*plVar4;
    (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar6;
  }
  __return_storage_ptr__->_M_string_length = plVar4[1];
  *plVar4 = (long)psVar6;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  if (local_80 != &local_70) {
    operator_delete(local_80);
  }
  if (local_50 != local_40) {
    operator_delete(local_50);
  }
  if (count != 0) {
    iVar8 = 0;
    do {
      if (iVar8 != 0) {
        ::std::__cxx11::string::append((char *)__return_storage_ptr__);
      }
      __val = iVar8;
      if (local_58->sel_vector != (sel_t *)0x0) {
        __val = (idx_t)local_58->sel_vector[iVar8];
      }
      cVar9 = '\x01';
      if (9 < __val) {
        uVar7 = __val;
        cVar3 = '\x04';
        do {
          cVar9 = cVar3;
          if (uVar7 < 100) {
            cVar9 = cVar9 + -2;
            goto LAB_0131c456;
          }
          if (uVar7 < 1000) {
            cVar9 = cVar9 + -1;
            goto LAB_0131c456;
          }
          if (uVar7 < 10000) goto LAB_0131c456;
          bVar1 = 99999 < uVar7;
          uVar7 = uVar7 / 10000;
          cVar3 = cVar9 + '\x04';
        } while (bVar1);
        cVar9 = cVar9 + '\x01';
      }
LAB_0131c456:
      local_80 = &local_70;
      ::std::__cxx11::string::_M_construct((ulong)&local_80,cVar9);
      ::std::__detail::__to_chars_10_impl<unsigned_long>((char *)local_80,(uint)local_78,__val);
      ::std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)local_80);
      if (local_80 != &local_70) {
        operator_delete(local_80);
      }
      iVar8 = iVar8 + 1;
    } while (iVar8 != count);
  }
  ::std::__cxx11::string::append((char *)__return_storage_ptr__);
  return __return_storage_ptr__;
}

Assistant:

string SelectionVector::ToString(idx_t count) const {
	string result = "Selection Vector (" + to_string(count) + ") [";
	for (idx_t i = 0; i < count; i++) {
		if (i != 0) {
			result += ", ";
		}
		result += to_string(get_index(i));
	}
	result += "]";
	return result;
}